

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::ListOp<tinyusdz::Path>::ListOp
          (ListOp<tinyusdz::Path> *this,ListOp<tinyusdz::Path> *param_1)

{
  ListOp<tinyusdz::Path> *param_1_local;
  ListOp<tinyusdz::Path> *this_local;
  
  this->is_explicit = (bool)(param_1->is_explicit & 1);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->explicit_items,&param_1->explicit_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->added_items,&param_1->added_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->prepended_items,&param_1->prepended_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->appended_items,&param_1->appended_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->deleted_items,&param_1->deleted_items);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->ordered_items,&param_1->ordered_items);
  return;
}

Assistant:

ListOp() : is_explicit(false) {}